

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_packssdw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  undefined1 auVar1 [16];
  
  auVar1 = packssdw(*(undefined1 (*) [16])d,*(undefined1 (*) [16])s);
  *(undefined1 (*) [16])d = auVar1;
  return;
}

Assistant:

void glue(helper_packssdw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    Reg r;

    r.W(0) = satsw(d->L(0));
    r.W(1) = satsw(d->L(1));
#if SHIFT == 1
    r.W(2) = satsw(d->L(2));
    r.W(3) = satsw(d->L(3));
#endif
    r.W((2 << SHIFT) + 0) = satsw(s->L(0));
    r.W((2 << SHIFT) + 1) = satsw(s->L(1));
#if SHIFT == 1
    r.W(6) = satsw(s->L(2));
    r.W(7) = satsw(s->L(3));
#endif
    *d = r;
}